

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O0

void push_complete_tx_timestamp(pending_tx_timestamps *tx_timestamps,timespec *to_add)

{
  uint uVar1;
  uint uVar2;
  timestamp_info *ptVar3;
  timestamp_info *ts_info;
  timespec *to_add_local;
  pending_tx_timestamps *tx_timestamps_local;
  
  ptVar3 = tx_timestamps->pending;
  uVar1 = tx_timestamps->tail;
  uVar2 = get_max_pending_reqs();
  ptVar3 = ptVar3 + (ulong)uVar1 % (ulong)uVar2;
  (ptVar3->time).tv_sec = to_add->tv_sec;
  (ptVar3->time).tv_nsec = to_add->tv_nsec;
  tx_timestamps->head = tx_timestamps->head + 1;
  tx_timestamps->tail = tx_timestamps->tail + 1;
  add_tx_timestamp(&ptVar3->time);
  return;
}

Assistant:

void push_complete_tx_timestamp(struct pending_tx_timestamps *tx_timestamps,
								struct timespec *to_add)
{
	struct timestamp_info *ts_info;

	ts_info =
		&tx_timestamps->pending[tx_timestamps->tail % get_max_pending_reqs()];
	ts_info->time = *to_add;
	// this is confusing but the consumed is used when receiving the reply
	tx_timestamps->head++;
	tx_timestamps->tail++;
	add_tx_timestamp(&ts_info->time);
}